

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O2

Move * cuddZddLinearDown(DdManager *table,int x,int xHigh,Move *prevMoves)

{
  DdHalfWord DVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  uint uVar5;
  DdHalfWord y;
  
  uVar5 = table->keysZ;
  DVar1 = cuddZddNextHigh(table,x);
  while( true ) {
    y = DVar1;
    if (xHigh < (int)y) {
      return (Move *)(DdNode *)prevMoves;
    }
    uVar2 = cuddZddSwapInPlace(table,x,y);
    if (((uVar2 == 0) || (uVar3 = cuddZddLinearInPlace(table,x,y), uVar3 == 0)) ||
       (pDVar4 = cuddDynamicAllocNode(table), pDVar4 == (DdNode *)0x0)) break;
    pDVar4->index = x;
    pDVar4->ref = y;
    (pDVar4->type).kids.T = (DdNode *)prevMoves;
    *(undefined4 *)&pDVar4->next = 0;
    prevMoves = (Move *)pDVar4;
    if ((int)uVar2 < (int)uVar3) {
      uVar3 = cuddZddLinearInPlace(table,x,y);
      if (uVar3 == 0) break;
      if (uVar3 != uVar2) {
        fprintf((FILE *)table->err,"Change in size after identity transformation! From %d to %d\n",
                (ulong)uVar2,(ulong)uVar3);
      }
    }
    else {
      *(undefined4 *)&pDVar4->next = 1;
      uVar2 = uVar3;
    }
    *(uint *)((long)&pDVar4->next + 4) = uVar2;
    if ((double)(int)uVar5 * table->maxGrowth < (double)(int)uVar2) {
      return (Move *)pDVar4;
    }
    if ((int)uVar2 < (int)uVar5) {
      uVar5 = uVar2;
    }
    DVar1 = cuddZddNextHigh(table,y);
    x = y;
  }
  while ((DdNode *)prevMoves != (DdNode *)0x0) {
    pDVar4 = (((DdNode *)prevMoves)->type).kids.T;
    ((DdNode *)prevMoves)->ref = 0;
    ((DdNode *)prevMoves)->next = table->nextFree;
    table->nextFree = (DdNode *)prevMoves;
    prevMoves = (Move *)pDVar4;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
cuddZddLinearDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move * prevMoves)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size, newsize;
    int         limitSize;

    moves = prevMoves;
    limitSize = table->keysZ;

    y = cuddZddNextHigh(table, x);
    while (y <= xHigh) {
        size = cuddZddSwapInPlace(table, x, y);
        if (size == 0)
            goto cuddZddLinearDownOutOfMem;
        newsize = cuddZddLinearInPlace(table, x, y);
        if (newsize == 0)
            goto cuddZddLinearDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL)
            goto cuddZddLinearDownOutOfMem;
        move->x = x;
        move->y = y;
        move->next = moves;
        moves = move;
        move->flags = CUDD_SWAP_MOVE;
        if (newsize > size) {
            /* Undo transformation. The transformation we apply is
            ** its own inverse. Hence, we just apply the transformation
            ** again.
            */
            newsize = cuddZddLinearInPlace(table,x,y);
            if (newsize == 0) goto cuddZddLinearDownOutOfMem;
            if (newsize != size) {
                (void) fprintf(table->err,"Change in size after identity transformation! From %d to %d\n",size,newsize);
            }
        } else {
            size = newsize;
            move->flags = CUDD_LINEAR_TRANSFORM_MOVE;
        }
        move->size = size;

        if ((double)size > (double)limitSize * table->maxGrowth)
            break;
        if (size < limitSize)
            limitSize = size;

        x = y;
        y = cuddZddNextHigh(table, x);
    }
    return(moves);

cuddZddLinearDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}